

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_abstracttxin.cpp
# Opt level: O0

void __thiscall
AbstractTxIn_WitnessStackError_Test::~AbstractTxIn_WitnessStackError_Test
          (AbstractTxIn_WitnessStackError_Test *this)

{
  AbstractTxIn_WitnessStackError_Test *this_local;
  
  ~AbstractTxIn_WitnessStackError_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST(AbstractTxIn, WitnessStackError) {
  AbstractTxIn actual = AbstractTxIn(expect_txid, expect_index, expect_sequence,
                                     expect_unlocking_script);

  try {
    actual.SetScriptWitnessStack(0, ByteData("0123456789"));
  } catch (const CfdException &e) {
    EXPECT_STREQ(e.what(), "vin out_of_range error.");
    return;
  }
  ASSERT_TRUE(false);
}